

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void insert_SNode_internal(Parser *p,SNode *sn)

{
  uint *puVar1;
  int iVar2;
  D_State *pDVar3;
  D_State *pDVar4;
  SNode **ppSVar5;
  SNode *pSVar6;
  uint uVar7;
  SNode **ppSVar8;
  ulong uVar9;
  ulong uVar10;
  
  pDVar3 = sn->state;
  pDVar4 = p->t->state;
  iVar2 = *(int *)&sn->initial_scope;
  uVar7 = (p->snode_hash).m;
  uVar10 = (ulong)uVar7;
  if (uVar7 < (p->snode_hash).n + 1) {
    ppSVar5 = (p->snode_hash).v;
    uVar7 = (p->snode_hash).i + 1;
    (p->snode_hash).i = uVar7;
    uVar7 = d_prime2[uVar7];
    (p->snode_hash).m = uVar7;
    ppSVar8 = (SNode **)calloc(1,(ulong)uVar7 << 3);
    (p->snode_hash).v = ppSVar8;
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      while (pSVar6 = ppSVar5[uVar9], pSVar6 != (SNode *)0x0) {
        ppSVar5[uVar9] = pSVar6->bucket_next;
        insert_SNode_internal(p,pSVar6);
      }
    }
    free(ppSVar5);
    uVar10 = (ulong)(p->snode_hash).m;
  }
  ppSVar5 = (p->snode_hash).v;
  uVar10 = (ulong)(uint)((int)(((long)pDVar3 - (long)pDVar4) / 0x78) * 0x1000 + iVar2) % uVar10;
  pSVar6 = ppSVar5[uVar10];
  sn->bucket_next = pSVar6;
  if (pSVar6 != sn) {
    ppSVar5[uVar10] = sn;
    puVar1 = &(p->snode_hash).n;
    *puVar1 = *puVar1 + 1;
    return;
  }
  __assert_fail("sn->bucket_next != sn",
                "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c",0xb2,
                "void insert_SNode_internal(Parser *, SNode *)");
}

Assistant:

void insert_SNode_internal(Parser *p, SNode *sn) {
  SNodeHash *ph = &p->snode_hash;
  uint h = SNODE_HASH(sn->state - p->t->state, sn->initial_scope), i;
  SNode *t;

  if (ph->n + 1 > ph->m) {
    SNode **v = ph->v;
    uint m = ph->m;
    ph->i++;
    ph->m = d_prime2[ph->i];
    ph->v = (SNode **)MALLOC(ph->m * sizeof(*ph->v));
    memset(ph->v, 0, ph->m * sizeof(*ph->v));
    for (i = 0; i < m; i++)
      while ((t = v[i])) {
        v[i] = v[i]->bucket_next;
        insert_SNode_internal(p, t);
      }
    FREE(v);
  }
  sn->bucket_next = ph->v[h % ph->m];
  assert(sn->bucket_next != sn);
  ph->v[h % ph->m] = sn;
  ph->n++;
}